

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void putcontig8bitYCbCr41tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  byte bVar2;
  TIFFRGBAImage *pTVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint Cb;
  uint uVar7;
  uint32_t g;
  uint32_t local_68;
  uint32_t local_64;
  uint local_60;
  uint32_t local_5c;
  uint local_58;
  uint local_54;
  TIFFRGBAImage *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_38 = (long)toskew;
  iVar5 = fromskew + 3;
  if (-1 < fromskew) {
    iVar5 = fromskew;
  }
  local_58 = w >> 2;
  local_40 = (ulong)(w & 3);
  local_48 = (long)((iVar5 >> 2) * 6);
  local_54 = w;
  local_50 = img;
  do {
    uVar7 = local_58;
    local_5c = h;
    if (3 < local_54) {
      do {
        pTVar3 = local_50;
        bVar1 = pp[4];
        Cb = (uint)bVar1;
        bVar2 = pp[5];
        uVar6 = (uint)bVar2;
        TIFFYCbCrtoRGB(local_50->ycbcr,(uint)*pp,Cb,uVar6,&local_60,&local_64,&local_68);
        *cp = local_68 << 0x10 | 0xff000000 | local_64 << 8 | local_60;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[1],(uint)bVar1,(uint)bVar2,&local_60,&local_64,
                       &local_68);
        cp[1] = local_68 << 0x10 | 0xff000000 | local_64 << 8 | local_60;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[2],Cb,uVar6,&local_60,&local_64,&local_68);
        cp[2] = local_68 << 0x10 | 0xff000000 | local_64 << 8 | local_60;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[3],Cb,uVar6,&local_60,&local_64,&local_68);
        cp[3] = local_68 << 0x10 | 0xff000000 | local_64 << 8 | local_60;
        cp = cp + 4;
        pp = pp + 6;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    uVar4 = local_40;
    pTVar3 = local_50;
    if (local_40 != 0) {
      uVar7 = (uint)pp[4];
      uVar6 = (uint)pp[5];
      if (local_40 != 1) {
        if ((int)local_40 != 2) {
          TIFFYCbCrtoRGB(local_50->ycbcr,(uint)pp[2],uVar7,uVar6,&local_60,&local_64,&local_68);
          cp[2] = local_64 << 8 | local_60 | local_68 << 0x10 | 0xff000000;
        }
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[1],uVar7,uVar6,&local_60,&local_64,&local_68);
        cp[1] = local_64 << 8 | local_60 | local_68 << 0x10 | 0xff000000;
      }
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)*pp,uVar7,uVar6,&local_60,&local_64,&local_68);
      *cp = local_64 << 8 | local_60 | local_68 << 0x10 | 0xff000000;
      cp = cp + uVar4;
      pp = pp + 6;
    }
    pp = pp + local_48;
    cp = cp + local_38;
    h = local_5c - 1;
  } while (h != 0);
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr41tile)
{
    (void)y;
    fromskew = (fromskew / 4) * (4 * 1 + 2);
    do
    {
        x = w >> 2;
        while (x > 0)
        {
            int32_t Cb = pp[4];
            int32_t Cr = pp[5];

            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            YCbCrtoRGB(cp[2], pp[2]);
            YCbCrtoRGB(cp[3], pp[3]);

            cp += 4;
            pp += 6;
            x--;
        }

        if ((w & 3) != 0)
        {
            int32_t Cb = pp[4];
            int32_t Cr = pp[5];

            switch ((w & 3))
            {
                case 3:
                    YCbCrtoRGB(cp[2], pp[2]); /*-fallthrough*/
                case 2:
                    YCbCrtoRGB(cp[1], pp[1]); /*-fallthrough*/
                case 1:
                    YCbCrtoRGB(cp[0], pp[0]); /*-fallthrough*/
                case 0:
                    break;
            }

            cp += (w & 3);
            pp += 6;
        }

        cp += toskew;
        pp += fromskew;
    } while (--h);
}